

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::Convert
          (string *__return_storage_ptr__,cmOutputConverter *this,RelativeRoot remote,string *local,
          OutputFormat output,bool optional)

{
  char *pcVar1;
  allocator local_89;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  string local_50;
  
  pcVar1 = GetRelativeRootPath(this,remote);
  if (pcVar1 != (char *)0x0) {
    if (local->_M_string_length == 0 || optional) {
      std::__cxx11::string::string((string *)&result,pcVar1,(allocator *)&local_50);
      ConvertToOutputFormat(__return_storage_ptr__,this,&result,output);
      std::__cxx11::string::~string((string *)&result);
    }
    else {
      components.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      components.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      components.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmsys::SystemTools::SplitPath(local,&components,true);
      std::__cxx11::string::string((string *)&local_50,pcVar1,&local_89);
      ConvertToRelativePath(&result,this,&components,&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      ConvertToOutputFormat(__return_storage_ptr__,this,&result,output);
      std::__cxx11::string::~string((string *)&result);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&components);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("remotePath != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmOutputConverter.cxx"
                ,0xab,
                "std::string cmOutputConverter::Convert(RelativeRoot, const std::string &, OutputFormat, bool) const"
               );
}

Assistant:

std::string cmOutputConverter::Convert(RelativeRoot remote,
                                      const std::string& local,
                                      OutputFormat output,
                                      bool optional) const
{
  const char* remotePath = this->GetRelativeRootPath(remote);

  // The relative root must have a path (i.e. not FULL or NONE)
  assert(remotePath != 0);

  if(!local.empty() && !optional)
    {
    std::vector<std::string> components;
    cmSystemTools::SplitPath(local, components);
    std::string result = this->ConvertToRelativePath(components, remotePath);
    return this->ConvertToOutputFormat(result, output);
    }

  return this->ConvertToOutputFormat(remotePath, output);
}